

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O2

void __thiscall
bal::Formula::add_parameter(Formula *this,string *key,string *name,string *value,bool b_quote)

{
  string *psVar1;
  char *pcVar2;
  iterator iVar3;
  undefined3 in_register_00000081;
  string item;
  string asStack_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  if (CONCAT31(in_register_00000081,b_quote) == 0) {
    std::__cxx11::string::string(asStack_a8,(string *)name);
    psVar1 = (string *)std::__cxx11::string::append((char *)asStack_a8);
    psVar1 = (string *)std::__cxx11::string::append(psVar1);
  }
  else {
    std::__cxx11::string::string(asStack_a8,(string *)name);
    psVar1 = (string *)std::__cxx11::string::append((char *)asStack_a8);
    pcVar2 = (char *)std::__cxx11::string::append(psVar1);
    psVar1 = (string *)std::__cxx11::string::append(pcVar2);
  }
  std::__cxx11::string::string((string *)&local_88,psVar1);
  std::__cxx11::string::~string(asStack_a8);
  iVar3 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->parameters_)._M_t,key);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->parameters_)._M_t._M_impl.super__Rb_tree_header) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_68,key,&local_88);
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->parameters_,&local_68);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_68);
  }
  else {
    if (iVar3._M_node[2]._M_parent != (_Base_ptr)0x0) {
      std::__cxx11::string::append((char *)(iVar3._M_node + 2));
    }
    std::__cxx11::string::append((string *)(iVar3._M_node + 2));
  }
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void Formula::add_parameter(const std::string& key, const std::string& name,
                       const std::string& value, const bool b_quote) {
        std::string item = (b_quote) ?
        std::string(name).append(": \"").append(value).append("\"") :
        std::string(name).append(": ").append(value);
        
        auto it = parameters_.find(key);
        if (it != parameters_.end()) {
            if (it->second.size() > 0) {
                it->second.append(", ");
            };
            it->second.append(item);
        } else {
            parameters_.insert({key, item});
        };
    }